

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_file_sink-inl.h
# Opt level: O1

void __thiscall
spdlog::sinks::basic_file_sink<std::mutex>::sink_it_(basic_file_sink<std::mutex> *this,log_msg *msg)

{
  formatter *pfVar1;
  size_t in_RCX;
  void *__buf;
  memory_buf_t formatted;
  undefined1 *local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  code *local_120;
  undefined1 local_118 [264];
  
  uStack_130 = 0;
  local_120 = ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::grow
  ;
  local_128 = 0xfa;
  pfVar1 = (this->super_base_sink<std::mutex>).formatter_._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  local_138 = local_118;
  (*pfVar1->_vptr_formatter[2])(pfVar1,msg,&local_138);
  details::file_helper::write(&this->file_helper_,(int)&local_138,__buf,in_RCX);
  if (local_138 != local_118) {
    free(local_138);
  }
  return;
}

Assistant:

SPDLOG_INLINE void basic_file_sink<Mutex>::sink_it_(const details::log_msg &msg) {
    memory_buf_t formatted;
    base_sink<Mutex>::formatter_->format(msg, formatted);
    file_helper_.write(formatted);
}